

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void random_colors(Model *model,TGAImage *image)

{
  array<vec<3UL,_int>,_3UL> pts_00;
  vec3f v;
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  reference pvVar6;
  TGAColor color;
  vec3i vVar7;
  double in_stack_fffffffffffffeb0;
  TGAColor local_fd;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  int local_d8;
  vec3i local_d0;
  vec3f local_c0;
  value_type local_a4;
  int local_98;
  undefined1 auStack_94 [4];
  int j;
  array<vec<3UL,_int>,_3UL> pts;
  size_t i;
  allocator<double> local_51;
  double local_50;
  undefined1 local_48 [8];
  vector<double,_std::allocator<double>_> zbuffer;
  vec3f light_dir;
  TGAImage *image_local;
  Model *model_local;
  
  vec<3UL,_double>::vec
            ((vec<3UL,_double> *)
             &zbuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0.0,0.0,-1.0);
  local_50 = std::numeric_limits<double>::max();
  local_50 = -local_50;
  std::allocator<double>::allocator(&local_51);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_48,360000,&local_50,&local_51);
  std::allocator<double>::~allocator(&local_51);
  pts._M_elems[2].y = 0;
  pts._M_elems[2].z = 0;
  while( true ) {
    uVar1 = pts._M_elems[2]._4_8_;
    sVar5 = Model::nfaces(model);
    if (sVar5 <= (ulong)uVar1) break;
    std::array<vec<3UL,_int>,_3UL>::array((array<vec<3UL,_int>,_3UL> *)auStack_94);
    for (local_98 = 0; local_98 < 3; local_98 = local_98 + 1) {
      Model::vert(&local_c0,model,pts._M_elems[2]._4_8_,(long)local_98);
      v.y = local_c0.z;
      v.x = local_c0.y;
      v.z = in_stack_fffffffffffffeb0;
      vVar7 = world2screen(v);
      local_d0 = vVar7;
      local_a4 = vVar7;
      pvVar6 = std::array<vec<3UL,_int>,_3UL>::operator[]
                         ((array<vec<3UL,_int>,_3UL> *)auStack_94,(long)local_98);
      *pvVar6 = local_a4;
    }
    local_d8 = pts._M_elems[2].x;
    local_e8._0_4_ = pts._M_elems[0].z;
    local_e8._4_4_ = pts._M_elems[1].x;
    local_e8._8_4_ = pts._M_elems[1].y;
    local_e8._12_4_ = pts._M_elems[1].z;
    local_f8._0_4_ = auStack_94;
    local_f8._4_4_ = j;
    local_f8._8_4_ = pts._M_elems[0].x;
    local_f8._12_4_ = pts._M_elems[0].y;
    iVar2 = rand();
    iVar3 = rand();
    iVar4 = rand();
    TGAColor::TGAColor(&local_fd,
                       (char)iVar2 +
                       ((char)(uint)((ulong)((long)iVar2 * 0x80808081) >> 0x27) -
                       (char)(iVar2 >> 0x1f)),
                       (char)iVar3 +
                       ((char)(uint)((ulong)((long)iVar3 * 0x80808081) >> 0x27) -
                       (char)(iVar3 >> 0x1f)),
                       (char)iVar4 +
                       ((char)(uint)((ulong)((long)iVar4 * 0x80808081) >> 0x27) -
                       (char)((long)iVar4 * 0x80808081 >> 0x3f)),0xff);
    color.bytespp = local_fd.bytespp;
    color.bgra[0] = local_fd.bgra[0];
    color.bgra[1] = local_fd.bgra[1];
    color.bgra[2] = local_fd.bgra[2];
    color.bgra[3] = local_fd.bgra[3];
    pts_00._M_elems[0].z = local_f8._8_4_;
    pts_00._M_elems[1].x = local_f8._12_4_;
    pts_00._M_elems[0].x = local_f8._0_4_;
    pts_00._M_elems[0].y = local_f8._4_4_;
    pts_00._M_elems[1].y = local_e8._0_4_;
    pts_00._M_elems[1].z = local_e8._4_4_;
    pts_00._M_elems[2].x = local_e8._8_4_;
    pts_00._M_elems[2].y = local_e8._12_4_;
    pts_00._M_elems[2].z = local_d8;
    in_stack_fffffffffffffeb0 = (double)local_e8._8_8_;
    triangle(pts_00,(vector<double,_std::allocator<double>_> *)local_48,image,color);
    pts._M_elems[2]._4_8_ = pts._M_elems[2]._4_8_ + 1;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_48);
  return;
}

Assistant:

void random_colors(Model &model, TGAImage &image)
{
    vec3f light_dir{0, 0, -1};
    std::vector<double> zbuffer(width * height, -std::numeric_limits<double>::max());
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec3i, 3> pts;
        for (int j = 0; j < 3; j++) pts[j] = world2screen(model.vert(i, j));
        triangle(pts, zbuffer, image, TGAColor(rand() % 255, rand() % 255, rand() % 255, 255));
    }
}